

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O3

int __thiscall cmsys::RegExpFind::regmatch(RegExpFind *this,char *prog)

{
  byte *pbVar1;
  ushort uVar2;
  int iVar3;
  uint uVar4;
  size_t __n;
  ulong uVar5;
  byte bVar6;
  char *pcVar7;
  byte bVar8;
  long lVar9;
  byte *prog_00;
  byte *pbVar10;
  
  if (prog != (char *)0x0) {
    pbVar10 = (byte *)this->reginput;
    pbVar1 = (byte *)this->regbol;
    do {
      if ((prog == &regdummy) ||
         (uVar2 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8,
         uVar2 == 0)) {
        prog_00 = (byte *)0x0;
LAB_004441c3:
        bVar8 = *prog;
      }
      else {
        bVar8 = *prog;
        if (bVar8 == 7) {
          prog_00 = (byte *)prog + -(ulong)uVar2;
          goto LAB_004441c3;
        }
        prog_00 = (byte *)prog + uVar2;
      }
      if (0x27 < bVar8) {
switchD_004441e1_caseD_c:
        pcVar7 = "RegularExpression::find(): Internal error -- memory corrupted.";
        goto LAB_004442cb;
      }
      uVar5 = (ulong)bVar8;
      switch(uVar5) {
      case 0:
        return 1;
      case 1:
        if (pbVar10 != pbVar1) {
          return 0;
        }
        break;
      case 2:
        if (*pbVar10 != 0) {
          return 0;
        }
        break;
      case 3:
        if (*pbVar10 == 0) {
          return 0;
        }
        pbVar10 = pbVar10 + 1;
        this->reginput = (char *)pbVar10;
        break;
      case 4:
        if (*pbVar10 == 0) {
          return 0;
        }
        pcVar7 = strchr((char *)((byte *)prog + 3),(int)(char)*pbVar10);
        if (pcVar7 == (char *)0x0) {
          return 0;
        }
        goto LAB_0044429f;
      case 5:
        if (*pbVar10 == 0) {
          return 0;
        }
        pcVar7 = strchr((char *)((byte *)prog + 3),(int)(char)*pbVar10);
        if (pcVar7 != (char *)0x0) {
          return 0;
        }
LAB_0044429f:
        pbVar10 = pbVar10 + 1;
LAB_004442a2:
        this->reginput = (char *)pbVar10;
        break;
      case 6:
        if (*prog_00 == 6) {
          pcVar7 = this->reginput;
          do {
            iVar3 = regmatch(this,(char *)((byte *)prog + 3));
            if (iVar3 != 0) {
              return 1;
            }
            this->reginput = pcVar7;
            if (prog == &regdummy) {
              return 0;
            }
            uVar2 = *(ushort *)((byte *)prog + 1) << 8 | *(ushort *)((byte *)prog + 1) >> 8;
            if (uVar2 == 0) {
              return 0;
            }
            uVar5 = -(ulong)uVar2;
            if (*prog != 7) {
              uVar5 = (ulong)uVar2;
            }
            pbVar10 = (byte *)prog + uVar5;
            prog = (char *)((byte *)prog + uVar5);
          } while (*pbVar10 == 6);
          return 0;
        }
        prog_00 = (byte *)prog + 3;
        break;
      case 7:
      case 9:
        break;
      case 8:
        if (((byte *)prog)[3] != *pbVar10) {
          return 0;
        }
        __n = strlen((char *)((byte *)prog + 3));
        if ((1 < __n) &&
           (iVar3 = strncmp((char *)((byte *)prog + 3),(char *)pbVar10,__n), iVar3 != 0)) {
          return 0;
        }
        pbVar10 = pbVar10 + __n;
        goto LAB_004442a2;
      case 10:
      case 0xb:
        bVar6 = 0;
        if (*prog_00 == 8) {
          bVar6 = prog_00[3];
        }
        pcVar7 = this->reginput;
        uVar4 = regrepeat(this,(char *)((byte *)prog + 3));
        if ((int)(uint)(bVar8 != 10) <= (int)uVar4) {
          lVar9 = (ulong)uVar4 + 1;
          while (((bVar6 != 0 && (bVar6 != *this->reginput)) ||
                 (iVar3 = regmatch(this,(char *)prog_00), iVar3 == 0))) {
            this->reginput = pcVar7 + lVar9 + -2;
            lVar9 = lVar9 + -1;
            if (lVar9 <= (long)(ulong)(bVar8 != 10)) {
              return 0;
            }
          }
          return 1;
        }
        return 0;
      default:
        goto switchD_004441e1_caseD_c;
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
        pcVar7 = this->reginput;
        iVar3 = regmatch(this,(char *)prog_00);
        if (iVar3 == 0) {
          return 0;
        }
        if (this->regstartp[uVar5 - 0x14] == (char *)0x0) {
          this->regstartp[uVar5 - 0x14] = pcVar7;
          return 1;
        }
        return 1;
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        pcVar7 = this->reginput;
        iVar3 = regmatch(this,(char *)prog_00);
        if (iVar3 == 0) {
          return 0;
        }
        if (this->regendp[uVar5 - 0x1e] == (char *)0x0) {
          this->regendp[uVar5 - 0x1e] = pcVar7;
          return 1;
        }
        return 1;
      }
      prog = (char *)prog_00;
    } while ((byte *)prog != (byte *)0x0);
  }
  pcVar7 = "RegularExpression::find(): Internal error -- corrupted pointers.";
LAB_004442cb:
  puts(pcVar7);
  return 0;
}

Assistant:

int RegExpFind::regmatch(const char* prog)
{
  const char* scan; // Current node.
  const char* next; // Next node.

  scan = prog;

  while (scan != KWSYS_NULLPTR) {

    next = regnext(scan);

    switch (OP(scan)) {
      case BOL:
        if (reginput != regbol)
          return (0);
        break;
      case EOL:
        if (*reginput != '\0')
          return (0);
        break;
      case ANY:
        if (*reginput == '\0')
          return (0);
        reginput++;
        break;
      case EXACTLY: {
        size_t len;
        const char* opnd;

        opnd = OPERAND(scan);
        // Inline the first character, for speed.
        if (*opnd != *reginput)
          return (0);
        len = strlen(opnd);
        if (len > 1 && strncmp(opnd, reginput, len) != 0)
          return (0);
        reginput += len;
      } break;
      case ANYOF:
        if (*reginput == '\0' ||
            strchr(OPERAND(scan), *reginput) == KWSYS_NULLPTR)
          return (0);
        reginput++;
        break;
      case ANYBUT:
        if (*reginput == '\0' ||
            strchr(OPERAND(scan), *reginput) != KWSYS_NULLPTR)
          return (0);
        reginput++;
        break;
      case NOTHING:
        break;
      case BACK:
        break;
      case OPEN + 1:
      case OPEN + 2:
      case OPEN + 3:
      case OPEN + 4:
      case OPEN + 5:
      case OPEN + 6:
      case OPEN + 7:
      case OPEN + 8:
      case OPEN + 9: {
        int no;
        const char* save;

        no = OP(scan) - OPEN;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set startp if some later invocation of the
          // same parentheses already has.
          //
          if (regstartp[no] == KWSYS_NULLPTR)
            regstartp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case CLOSE + 1:
      case CLOSE + 2:
      case CLOSE + 3:
      case CLOSE + 4:
      case CLOSE + 5:
      case CLOSE + 6:
      case CLOSE + 7:
      case CLOSE + 8:
      case CLOSE + 9: {
        int no;
        const char* save;

        no = OP(scan) - CLOSE;
        save = reginput;

        if (regmatch(next)) {

          //
          // Don't set endp if some later invocation of the
          // same parentheses already has.
          //
          if (regendp[no] == KWSYS_NULLPTR)
            regendp[no] = save;
          return (1);
        } else
          return (0);
      }
      //              break;
      case BRANCH: {

        const char* save;

        if (OP(next) != BRANCH) // No choice.
          next = OPERAND(scan); // Avoid recursion.
        else {
          do {
            save = reginput;
            if (regmatch(OPERAND(scan)))
              return (1);
            reginput = save;
            scan = regnext(scan);
          } while (scan != KWSYS_NULLPTR && OP(scan) == BRANCH);
          return (0);
          // NOTREACHED
        }
      } break;
      case STAR:
      case PLUS: {
        char nextch;
        int no;
        const char* save;
        int min_no;

        //
        // Lookahead to avoid useless match attempts when we know
        // what character comes next.
        //
        nextch = '\0';
        if (OP(next) == EXACTLY)
          nextch = *OPERAND(next);
        min_no = (OP(scan) == STAR) ? 0 : 1;
        save = reginput;
        no = regrepeat(OPERAND(scan));
        while (no >= min_no) {
          // If it could work, try it.
          if (nextch == '\0' || *reginput == nextch)
            if (regmatch(next))
              return (1);
          // Couldn't or didn't -- back up.
          no--;
          reginput = save + no;
        }
        return (0);
      }
      //              break;
      case END:
        return (1); // Success!

      default:
        // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
        printf(
          "RegularExpression::find(): Internal error -- memory corrupted.\n");
        return 0;
    }
    scan = next;
  }

  //
  //  We get here only if there's trouble -- normally "case END" is the
  //  terminating point.
  //
  // RAISE Error, SYM(RegularExpression), SYM(Internal_Error),
  printf("RegularExpression::find(): Internal error -- corrupted pointers.\n");
  return (0);
}